

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  idx_t *piVar1;
  data_ptr_t pdVar2;
  Vector *result_00;
  Vector *pVVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t i;
  ulong uVar7;
  long lVar8;
  OrderModifiers in_R9W;
  long *plVar9;
  Vector *pVVar10;
  string_t sort_key;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  result_00 = (Vector *)ListVector::GetListSize(result);
  if (count == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_78.sel)->sel_vector[iVar5];
      }
      if (**(long **)(local_78.data + iVar6 * 8) != 0) {
        lVar8 = lVar8 + *(long *)(**(long **)(local_78.data + iVar6 * 8) + 0x20);
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  ListVector::Reserve(result,(idx_t)(&result_00->vector_type + lVar8));
  pVVar3 = ListVector::GetEntry(result);
  if (count != 0) {
    pdVar2 = result->data;
    uVar7 = 0;
    do {
      uVar4 = uVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_78.sel)->sel_vector[uVar7];
      }
      plVar9 = *(long **)(local_78.data + uVar4 * 8);
      piVar1 = (idx_t *)(pdVar2 + uVar7 * 0x10);
      *(Vector **)(pdVar2 + uVar7 * 0x10) = result_00;
      if (*plVar9 == 0) {
        iVar5 = 0;
      }
      else {
        plVar9 = *(long **)(*plVar9 + 0x18);
        pVVar10 = result_00;
        if (plVar9 != (long *)0x0) {
          do {
            sort_key.value.pointer.ptr = (char *)pVVar3;
            sort_key.value._0_8_ = plVar9[2];
            CreateSortKeyHelpers::DecodeSortKey
                      ((CreateSortKeyHelpers *)plVar9[1],sort_key,result_00,0x302,in_R9W);
            result_00 = (Vector *)&result_00->field_0x1;
            plVar9 = (long *)*plVar9;
          } while (plVar9 != (long *)0x0);
          pVVar10 = (Vector *)*piVar1;
        }
        iVar5 = (long)result_00 - (long)pVVar10;
      }
      piVar1[1] = iVar5;
      uVar7 = uVar7 + 1;
    } while (uVar7 != count);
  }
  ListVector::SetListSize(result,(idx_t)result_00);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}